

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_1::BinaryWriter::WriteMemory(BinaryWriter *this,Memory *memory)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  
  uVar3 = memory->page_size;
  WriteU32Leb128(this->stream_,
                 (uint)(memory->page_limits).has_max + (uint)(memory->page_limits).is_shared * 2 +
                 (uint)(memory->page_limits).is_64 * 4 + (uint)(uVar3 != 0x10000) * 8,
                 "limits: flags");
  WriteLimitsData(this->stream_,&memory->page_limits);
  if (uVar3 == 0x10000) {
    return;
  }
  uVar3 = 0;
  if (1 < memory->page_size) {
    uVar3 = 0;
    uVar2 = memory->page_size;
    do {
      uVar3 = uVar3 + 1;
      bVar1 = 3 < uVar2;
      uVar2 = uVar2 >> 1;
    } while (bVar1);
  }
  WriteU32Leb128(this->stream_,uVar3,"memory page size");
  return;
}

Assistant:

void BinaryWriter::WriteMemory(const Memory* memory) {
  uint32_t flags = ComputeLimitsFlags(&memory->page_limits);
  const bool custom_page_size = memory->page_size != WABT_DEFAULT_PAGE_SIZE;
  flags |= custom_page_size ? WABT_BINARY_LIMITS_HAS_CUSTOM_PAGE_SIZE_FLAG : 0;
  WriteLimitsFlags(stream_, flags);
  WriteLimitsData(stream_, &memory->page_limits);
  if (custom_page_size) {
    WriteU32Leb128(stream_, log2_u32(memory->page_size), "memory page size");
  }
}